

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O1

void __thiscall
gl3cts::TransformFeedbackOverflowQueryErrorIncompatibleTarget::deinit
          (TransformFeedbackOverflowQueryErrorIncompatibleTarget *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar2 = (*((this->super_TransformFeedbackOverflowQueryErrorBase).
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar3 + 0x458))(1,&this->m_incompatible_query);
  (**(code **)(lVar3 + 0x458))(1,&this->m_overflow_query);
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    ((TransformFeedbackOverflowQueryBaseTest *)this);
  if (bVar1) {
    (**(code **)(lVar3 + 0x458))(1,&this->m_stream_overflow_query);
  }
  tcu::TestNode::deinit((TestNode *)this);
  return;
}

Assistant:

virtual void deinit()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.deleteQueries(1, &m_incompatible_query);

		gl.deleteQueries(1, &m_overflow_query);

		if (supportsTransformFeedback3())
		{
			gl.deleteQueries(1, &m_stream_overflow_query);
		}

		TransformFeedbackOverflowQueryErrorBase::deinit();
	}